

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserBase.cpp
# Opt level: O0

Diagnostic * __thiscall
slang::parsing::ParserBase::addDiag(ParserBase *this,DiagCode code,SourceLocation location)

{
  SourceLocation location_00;
  bool bVar1;
  Diagnostic *pDVar2;
  SourceLocation in_RDX;
  ParserBase *in_RDI;
  Token last;
  ParserBase *in_stack_ffffffffffffff78;
  undefined6 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8e;
  undefined1 in_stack_ffffffffffffff8f;
  undefined1 uVar3;
  ParserBase *in_stack_ffffffffffffff90;
  string_view local_60;
  SourceLocation local_50;
  SourceLocation local_48;
  Token local_40;
  Token local_30;
  SourceLocation local_20 [2];
  SourceLocation local_10 [2];
  
  local_10[0] = in_RDX;
  bVar1 = peek(in_stack_ffffffffffffff90,
               CONCAT11(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff8e));
  uVar3 = false;
  if (bVar1) {
    local_30 = peek(in_stack_ffffffffffffff78);
    local_20[0] = Token::location(&local_30);
    uVar3 = SourceLocation::operator==(local_20,local_10);
  }
  if ((bool)uVar3 != false) {
    local_40 = getLastConsumed(in_RDI);
    bVar1 = Token::operator_cast_to_bool((Token *)0xa712c9);
    if (bVar1) {
      local_50 = Token::location(&local_40);
      local_60 = Token::rawText((Token *)in_stack_ffffffffffffff90);
      std::basic_string_view<char,_std::char_traits<char>_>::size(&local_60);
      local_48 = SourceLocation::operator+<unsigned_long>
                           ((SourceLocation *)
                            CONCAT17(uVar3,CONCAT16(in_stack_ffffffffffffff8e,
                                                    in_stack_ffffffffffffff88)),
                            (unsigned_long)in_RDI);
      local_10[0] = local_48;
    }
  }
  getDiagnostics((ParserBase *)0xa71324);
  location_00._6_1_ = in_stack_ffffffffffffff8e;
  location_00._0_6_ = in_stack_ffffffffffffff88;
  location_00._7_1_ = uVar3;
  pDVar2 = Diagnostics::add((Diagnostics *)in_RDI,local_10[0]._4_4_,location_00);
  return pDVar2;
}

Assistant:

Diagnostic& ParserBase::addDiag(DiagCode code, SourceLocation location) {
    // If we issued this error in response to seeing an EOF token, back up and put
    // the error on the last consumed token instead.
    if (peek(TokenKind::EndOfFile) && peek().location() == location) {
        Token last = getLastConsumed();
        if (last)
            location = last.location() + last.rawText().size();
    }

    return getDiagnostics().add(code, location);
}